

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

uint16_t __thiscall capnp::DynamicEnum::asImpl(DynamicEnum *this,uint64_t requestedTypeId)

{
  uint64_t uVar1;
  Reader RStack_48;
  
  Schema::getProto(&RStack_48,(Schema *)this);
  if (RStack_48._reader.dataSize < 0x40) {
    uVar1 = 0;
  }
  else {
    uVar1 = *RStack_48._reader.data;
  }
  if (uVar1 != requestedTypeId) {
    asImpl();
  }
  return this->value;
}

Assistant:

uint16_t DynamicEnum::asImpl(uint64_t requestedTypeId) const {
  KJ_REQUIRE(requestedTypeId == schema.getProto().getId(),
             "Type mismatch in DynamicEnum.as().") {
    // use it anyway
    break;
  }
  return value;
}